

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void dump_row(long count,int numinrow,int *chs)

{
  ushort **ppuVar1;
  int __c;
  ulong uVar2;
  ulong uVar3;
  
  printf("%08lX:",count - numinrow);
  if (0 < numinrow) {
    uVar2 = (ulong)(uint)numinrow;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (uVar3 == 8) {
        printf(" :");
      }
      printf(" %02X",(ulong)(uint)chs[uVar3]);
    }
    for (; numinrow < 0x10; numinrow = numinrow + 1) {
      if (numinrow == 8) {
        printf(" :");
      }
      printf("   ");
    }
    printf("  ");
    ppuVar1 = __ctype_b_loc();
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      __c = 0x2e;
      if (((*ppuVar1)[chs[uVar3]] >> 0xe & 1) != 0) {
        __c = chs[uVar3];
      }
      putchar(__c);
    }
  }
  putchar(10);
  return;
}

Assistant:

static void dump_row(long count, int numinrow, int *chs)
{
  int i;

  printf("%08lX:", count - numinrow);

  if (numinrow > 0) {
    for (i = 0; i < numinrow; i++) {
      if (i == 8) {
        printf(" :");
      }
      printf(" %02X", chs[i]);
    }
    for (i = numinrow; i < 16; i++) {
      if (i == 8) {
        printf(" :");
      }
      printf("   ");
    }
    printf("  ");
    for (i = 0; i < numinrow; i++) {
      if (isprint(chs[i])) {
        printf("%c", chs[i]);
      } else {
        printf(".");
      }
    }
  }
  printf("\n");
}